

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

bool __thiscall
Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite(Box<Imath_3_2::Vec3<float>_> *this)

{
  float fVar1;
  float *in_RDI;
  float fVar2;
  
  fVar1 = *in_RDI;
  fVar2 = std::numeric_limits<float>::lowest();
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    fVar1 = in_RDI[3];
    fVar2 = std::numeric_limits<float>::max();
    if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
      fVar1 = in_RDI[1];
      fVar2 = std::numeric_limits<float>::lowest();
      if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
        fVar1 = in_RDI[4];
        fVar2 = std::numeric_limits<float>::max();
        if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
          fVar1 = in_RDI[2];
          fVar2 = std::numeric_limits<float>::lowest();
          if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
            fVar1 = in_RDI[5];
            fVar2 = std::numeric_limits<float>::max();
            if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Box<Vec3<T>>::isInfinite () const IMATH_NOEXCEPT
{
    if (min.x != std::numeric_limits<T>::lowest () ||
        max.x != std::numeric_limits<T>::max () ||
        min.y != std::numeric_limits<T>::lowest () ||
        max.y != std::numeric_limits<T>::max () ||
        min.z != std::numeric_limits<T>::lowest () ||
        max.z != std::numeric_limits<T>::max ())
        return false;

    return true;
}